

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

string * __thiscall
cmCTestCVS::ComputeBranchFlag(string *__return_storage_ptr__,cmCTestCVS *this,string *dir)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  allocator<char> local_305;
  undefined4 local_304;
  basic_string_view<char,_std::char_traits<char>_> local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  cmAlphaNum local_2e0;
  cmAlphaNum local_2b0;
  undefined1 local_279;
  long local_278;
  ifstream tagStream;
  undefined1 local_70 [8];
  string tagLine;
  string local_40 [8];
  string tagFile;
  string *dir_local;
  cmCTestCVS *this_local;
  string *flag;
  
  tagFile.field_2._8_8_ = dir;
  std::__cxx11::string::string(local_40,(string *)&(this->super_cmCTestVC).SourceDirectory);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=(local_40,"/");
    std::__cxx11::string::operator+=(local_40,(string *)tagFile.field_2._8_8_);
  }
  std::__cxx11::string::operator+=(local_40,"/CVS/Tag");
  std::__cxx11::string::string((string *)local_70);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_278,pcVar3,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_278 + *(long *)(local_278 + -0x18)));
  if ((((bVar1) &&
       (bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_278,(string *)local_70,(bool *)0x0,0xffffffffffffffff),
       bVar1)) && (uVar2 = std::__cxx11::string::size(), 1 < uVar2)) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_70), *pcVar3 == 'T')) {
    local_279 = 0;
    cmAlphaNum::cmAlphaNum(&local_2b0,"-r");
    local_300 = (basic_string_view<char,_std::char_traits<char>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    local_2f0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_300,1,0xffffffffffffffff);
    cmAlphaNum::cmAlphaNum(&local_2e0,local_2f0);
    cmStrCat<>(__return_storage_ptr__,&local_2b0,&local_2e0);
    local_279 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-b",&local_305);
    std::allocator<char>::~allocator(&local_305);
  }
  local_304 = 1;
  std::ifstream::~ifstream(&local_278);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCVS::ComputeBranchFlag(std::string const& dir)
{
  // Compute the tag file location for this directory.
  std::string tagFile = this->SourceDirectory;
  if (!dir.empty()) {
    tagFile += "/";
    tagFile += dir;
  }
  tagFile += "/CVS/Tag";

  // Lookup the branch in the tag file, if any.
  std::string tagLine;
  cmsys::ifstream tagStream(tagFile.c_str());
  if (tagStream && cmSystemTools::GetLineFromStream(tagStream, tagLine) &&
      tagLine.size() > 1 && tagLine[0] == 'T') {
    // Use the branch specified in the tag file.
    std::string flag = cmStrCat("-r", cm::string_view(tagLine).substr(1));
    return flag;
  }
  // Use the default branch.
  return "-b";
}